

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O1

void CallSignalWithSingleConnection_SignalShouldBeCalled(void)

{
  bool receiverCalled;
  signal<void_(int,_bool)> sg;
  bool local_59;
  signal<void_(int,_bool)> local_58;
  bool *local_48;
  char acStack_40 [8];
  code *local_38;
  code *pcStack_30;
  connection local_28;
  
  TestRunner::StartTest("CallSignalWithSingleConnection_SignalShouldBeCalled");
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  (local_58._data.
   super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_58._data.
   super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_58._data.
   super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011a9b0
  ;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (local_58._data.
            super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi + 1);
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._M_use_count = 0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._M_weak_count = 0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = 0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = 0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_use_count = 0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_weak_count = 0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_use_count = 0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_58._data.
    super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[4]._M_use_count =
       local_58._data.
       super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi + 4;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._vptr__Sp_counted_base =
       (_func_int **)
       (local_58._data.
        super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi + 4);
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_48 = &local_59;
  local_59 = false;
  acStack_40[0] = '\a';
  acStack_40[1] = '\0';
  acStack_40[2] = '\0';
  acStack_40[3] = '\0';
  acStack_40[4] = '\x01';
  acStack_40[5] = '\0';
  acStack_40[6] = '\0';
  acStack_40[7] = '\0';
  pcStack_30 = std::
               _Function_handler<void_(int,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/balmerdx[P]lsignal/tests/test_basic.cpp:61:44)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(int,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/balmerdx[P]lsignal/tests/test_basic.cpp:61:44)>
             ::_M_manager;
  lsignal::signal<void_(int,_bool)>::connect
            ((signal<void_(int,_bool)> *)&local_28,(int)&local_58,(sockaddr *)&local_48,0);
  lsignal::connection::~connection(&local_28);
  lsignal::signal<void_(int,_bool)>::operator()(&local_58,7,true);
  AssertHelper::VerifyValue(local_59,true,"Receiver should be called.");
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  if (local_58._data.
      super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58._data.
               super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void CallSignalWithSingleConnection_SignalShouldBeCalled()
{
	TestRunner::StartTest(MethodName);

	lsignal::signal<void(int, bool)> sg;

	int paramOne = 7;
	bool paramTwo = true;

	bool receiverCalled = false;

	std::function<void(int, bool)> receiver = [=, &receiverCalled](int p0, bool p1)
	{
		receiverCalled = true;

		AssertHelper::VerifyValue(p0, paramOne, "First parameter should be as expected.");
		AssertHelper::VerifyValue(p1, paramTwo, "Second parameter should be as expected.");
	};

	sg.connect(receiver, nullptr);

	sg(paramOne, paramTwo);

	AssertHelper::VerifyValue(receiverCalled, true, "Receiver should be called.");
}